

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::CopyTest::CheckData(CopyTest *this,GLenum target,GLuint size)

{
  ulong uVar1;
  ostringstream *this_00;
  long lVar2;
  long lVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  GLubyte *pGVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  string local_200;
  string local_1e0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uVar6 = (ulong)size;
  pGVar5 = (GLubyte *)operator_new__(uVar6);
  this->m_result = pGVar5;
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0xaa0))(target,0,0x1908,0x1401,pGVar5);
  err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(err,"glGetCompressedTexImage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x157c);
  bVar9 = true;
  if (size != 0) {
    if (*this->m_result == '\0') {
      uVar7 = 0;
      do {
        if (uVar6 - 1 == uVar7) {
          return true;
        }
        lVar2 = uVar7 + 1;
        uVar1 = uVar7 + 1;
        lVar3 = uVar7 + 1;
        uVar7 = uVar1;
      } while (s_texture_data[lVar2] == this->m_result[lVar3]);
      bVar9 = uVar6 <= uVar1;
    }
    else {
      bVar9 = false;
    }
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    pcVar8 = "glCopyTextureSubImage*D created texture with data ";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"glCopyTextureSubImage*D created texture with data ",0x32);
    DataToString_abi_cxx11_(&local_1e0,(CopyTest *)pcVar8,size,s_texture_data);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    pcVar8 = " however texture contains data ";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," however texture contains data ",0x1f);
    DataToString_abi_cxx11_(&local_200,(CopyTest *)pcVar8,size,this->m_result);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,". Texture target was ",0x15);
    local_1c0.m_getName = glu::getTextureTargetName;
    local_1c0.m_value = target;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Test fails.",0xd);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  return bVar9;
}

Assistant:

bool CopyTest::CheckData(glw::GLenum target, glw::GLuint size)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check texture content with reference. */
	m_result = new glw::GLubyte[size];

	if (DE_NULL == m_result)
	{
		throw 0;
	}

	gl.getTexImage(target, 0, GL_RGBA, GL_UNSIGNED_BYTE, m_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");

	for (glw::GLuint i = 0; i < size; ++i)
	{
		if (s_texture_data[i] != m_result[i])
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glCopyTextureSubImage*D created texture with data "
				<< DataToString(size, s_texture_data) << " however texture contains data "
				<< DataToString(size, m_result) << ". Texture target was " << glu::getTextureTargetStr(target)
				<< ". Test fails." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}